

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_expand_data.cc
# Opt level: O1

void __thiscall
ctemplate::PerExpandData::InsertForModifiers(PerExpandData *this,char *key,void *value)

{
  DataMap *pDVar1;
  mapped_type *ppvVar2;
  char *local_18;
  
  local_18 = key;
  if (this->map_ == (DataMap *)0x0) {
    pDVar1 = (DataMap *)operator_new(0x38);
    (pDVar1->_M_h)._M_buckets = &(pDVar1->_M_h)._M_single_bucket;
    (pDVar1->_M_h)._M_bucket_count = 1;
    (pDVar1->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pDVar1->_M_h)._M_element_count = 0;
    (pDVar1->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (pDVar1->_M_h)._M_rehash_policy._M_next_resize = 0;
    (pDVar1->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    this->map_ = pDVar1;
  }
  ppvVar2 = std::__detail::
            _Map_base<const_char_*,_std::pair<const_char_*const,_const_void_*>,_std::allocator<std::pair<const_char_*const,_const_void_*>_>,_std::__detail::_Select1st,_ctemplate::PerExpandData::DataEq,_ctemplate::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<const_char_*,_std::pair<const_char_*const,_const_void_*>,_std::allocator<std::pair<const_char_*const,_const_void_*>_>,_std::__detail::_Select1st,_ctemplate::PerExpandData::DataEq,_ctemplate::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this->map_,&local_18);
  *ppvVar2 = value;
  return;
}

Assistant:

void PerExpandData::InsertForModifiers(const char* key, const void* value) {
  if (!map_)
    map_ = new DataMap;
  (*map_)[key] = value;
}